

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_33804::
ARTCorrectnessTest_Node48KeyPrefixMerge_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Node48KeyPrefixMerge_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  initializer_list<int> absent_keys;
  key_view kVar1;
  value_view v;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  node_type_counter_array local_540;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  kVar1 = unodb::test::
          tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key(&local_500,10);
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_key_range_internal(&local_500,kVar1,0x11,false);
  kVar1 = unodb::test::
          tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key(&local_500,0x2010);
  v._M_extent._M_extent_value = 2;
  v._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal(&local_500,kVar1,v,false);
  local_540._M_elems[0] = 0x12;
  local_540._M_elems[1] = 1;
  local_540._M_elems[2] = 0;
  local_540._M_elems[3] = 1;
  local_540._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts(&local_500,&local_540);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
  ::
  remove<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,int>
            ((tree_verifier<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
              *)&local_500,0x2010,false);
  unodb::test::allocation_failure_injector::fail_on_nth_allocation_.
  super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>.
  _M_i = (__atomic_base<unsigned_long>)0;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(&local_500);
  local_540._M_elems[0] = 0x201000000009;
  local_540._M_elems[1] = CONCAT44(local_540._M_elems[1]._4_4_,0x1c);
  absent_keys._M_len = 3;
  absent_keys._M_array = (iterator)&local_540;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>(&local_500,absent_keys);
  local_540._M_elems[0] = 1;
  local_540._M_elems[1] = 0;
  local_540._M_elems[2] = 0;
  local_540._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_shrinking_inodes(&local_500,(inode_type_counter_array *)&local_540);
  local_540._M_elems[0] = 0x11;
  local_540._M_elems[1] = 0;
  local_540._M_elems[2] = 0;
  local_540._M_elems[3] = 1;
  local_540._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts(&local_500,&local_540);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~olc_db(&local_500.test_db);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node48KeyPrefixMerge) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(10, 17);
  // Insert a value that does not share full prefix with the current Node48
  verifier.insert(0x2010, unodb::test::test_values[1]);
#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({18, 1, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  // And delete it, so that upper level Node4 key prefix gets merged with
  // Node48 one
  unodb::test::must_not_allocate([&verifier] { verifier.remove(0x2010); });

  verifier.check_present_values();
  verifier.check_absent_keys({9, 0x2010, 28});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({1, 0, 0, 0});
  verifier.assert_node_counts({17, 0, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}